

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O0

QMenu * __thiscall QScrollBar::createStandardContextMenu(QScrollBar *this,QPoint position)

{
  long lVar1;
  QLatin1StringView str;
  QScrollBarPrivate *pQVar2;
  QWidget *s;
  QWidget *pQVar3;
  QWindow *pQVar4;
  QTLWExtra *pQVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QTLWExtra *menuTopData;
  QMenu *menu;
  bool horiz;
  QScreen *in_stack_fffffffffffffe28;
  int n;
  QWidgetPrivate *in_stack_fffffffffffffe30;
  QAnyStringView *in_stack_fffffffffffffe38;
  QWidget *in_stack_fffffffffffffe40;
  QWidget *in_stack_fffffffffffffe48;
  QMenu *in_stack_fffffffffffffe50;
  anon_class_24_3_c418c12c_for_o *in_stack_fffffffffffffe58;
  QWidget *pQVar7;
  QString *in_stack_fffffffffffffe68;
  QWidget *pQVar8;
  QWidget *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QScrollBar *)0x67b9ce);
  bVar6 = (pQVar2->super_QAbstractSliderPrivate).orientation != Horizontal;
  s = (QWidget *)operator_new(0x28);
  QMenu::QMenu(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  this_00 = s;
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30);
  str.m_data = (char *)in_stack_fffffffffffffe48;
  str.m_size = (qsizetype)in_stack_fffffffffffffe40;
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffe38,str);
  QObject::setObjectName((QAnyStringView *)s);
  pQVar3 = QWidget::window(in_stack_fffffffffffffe40);
  if (pQVar3 != (QWidget *)0x0) {
    QWidget::window(in_stack_fffffffffffffe40);
    pQVar4 = QWidget::windowHandle((QWidget *)in_stack_fffffffffffffe30);
    if (pQVar4 != (QWindow *)0x0) {
      QMenuPrivate::get((QMenu *)0x67ba8e);
      pQVar5 = QWidgetPrivate::topData(in_stack_fffffffffffffe30);
      if (pQVar5 != (QTLWExtra *)0x0) {
        QWidget::window(in_stack_fffffffffffffe40);
        QWidget::windowHandle((QWidget *)in_stack_fffffffffffffe30);
        QWindow::screen();
        QPointer<QScreen>::operator=
                  ((QPointer<QScreen> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      }
    }
  }
  n = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  pQVar3 = s;
  tr((char *)in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,n);
  QWidget::addAction<QScrollBar*,QScrollBar::createStandardContextMenu(QPoint)::__0,void>
            (this_00,in_stack_fffffffffffffe68,(QScrollBar **)pQVar3,in_stack_fffffffffffffe58);
  QString::~QString((QString *)0x67bb5e);
  QMenu::addSeparator((QMenu *)in_stack_fffffffffffffe40);
  pQVar8 = s;
  if (bVar6) {
    tr((char *)in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,n);
  }
  else {
    tr((char *)in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,n);
  }
  QWidget::addAction<QScrollBar*,QScrollBar::createStandardContextMenu(QPoint)::__1,void>
            (this_00,(QString *)pQVar8,(QScrollBar **)pQVar3,
             (anon_class_8_1_8991fb9c_for_o *)in_stack_fffffffffffffe58);
  QString::~QString((QString *)0x67bbfc);
  pQVar7 = s;
  if (bVar6) {
    tr((char *)in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,n);
  }
  else {
    tr((char *)in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,n);
  }
  QWidget::addAction<QScrollBar*,QScrollBar::createStandardContextMenu(QPoint)::__2,void>
            (this_00,(QString *)pQVar8,(QScrollBar **)pQVar3,(anon_class_8_1_8991fb9c_for_o *)pQVar7
            );
  QString::~QString((QString *)0x67bc90);
  QMenu::addSeparator((QMenu *)in_stack_fffffffffffffe40);
  if (bVar6) {
    tr((char *)in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,n);
  }
  else {
    tr((char *)in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,n);
  }
  QWidget::addAction<QScrollBar*,QScrollBar::createStandardContextMenu(QPoint)::__3,void>
            (this_00,(QString *)pQVar8,(QScrollBar **)pQVar3,(anon_class_8_1_8991fb9c_for_o *)pQVar7
            );
  QString::~QString((QString *)0x67bd2e);
  if (bVar6) {
    tr((char *)in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,n);
  }
  else {
    tr((char *)in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,n);
  }
  QWidget::addAction<QScrollBar*,QScrollBar::createStandardContextMenu(QPoint)::__4,void>
            (this_00,(QString *)pQVar8,(QScrollBar **)pQVar3,(anon_class_8_1_8991fb9c_for_o *)pQVar7
            );
  QString::~QString((QString *)0x67bdc2);
  QMenu::addSeparator((QMenu *)in_stack_fffffffffffffe40);
  if (bVar6) {
    tr((char *)in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,n);
  }
  else {
    tr((char *)in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,n);
  }
  QWidget::addAction<QScrollBar*,QScrollBar::createStandardContextMenu(QPoint)::__5,void>
            (this_00,(QString *)pQVar8,(QScrollBar **)pQVar3,(anon_class_8_1_8991fb9c_for_o *)pQVar7
            );
  QString::~QString((QString *)0x67be60);
  if (bVar6) {
    tr((char *)s,(char *)in_stack_fffffffffffffe30,n);
  }
  else {
    tr((char *)s,(char *)in_stack_fffffffffffffe30,n);
  }
  QWidget::addAction<QScrollBar*,QScrollBar::createStandardContextMenu(QPoint)::__6,void>
            (this_00,(QString *)pQVar8,(QScrollBar **)pQVar3,(anon_class_8_1_8991fb9c_for_o *)pQVar7
            );
  QString::~QString((QString *)0x67bef4);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QMenu *)s;
}

Assistant:

QMenu *QScrollBar::createStandardContextMenu(QPoint position)
{
#if QT_CONFIG(menu)
    const bool horiz = HORIZONTAL;
    QMenu *menu = new QMenu();
    menu->setObjectName("qt_scrollbar_menu"_L1);

    if (window() && window()->windowHandle()) {
        if (auto *menuTopData = QMenuPrivate::get(menu)->topData())
            menuTopData->initialScreen = window()->windowHandle()->screen();
    }

    menu->addAction(tr("Scroll here"), this, [this, horiz, position] {
        setValue(d_func()->pixelPosToRangeValue(horiz ? position.x() : position.y()));
    });
    menu->addSeparator();
    menu->addAction(horiz ? tr("Left edge") : tr("Top"), this, [this] {
        triggerAction(QAbstractSlider::SliderToMinimum);
    });
    menu->addAction(horiz ? tr("Right edge") : tr("Bottom"), this, [this] {
        triggerAction(QAbstractSlider::SliderToMaximum);
    });
    menu->addSeparator();
    menu->addAction(horiz ? tr("Page left") : tr("Page up"), this, [this] {
        triggerAction(QAbstractSlider::SliderPageStepSub);
    });
    menu->addAction(horiz ? tr("Page right") : tr("Page down"), this, [this] {
        triggerAction(QAbstractSlider::SliderPageStepAdd);
    });
    menu->addSeparator();
    menu->addAction(horiz ? tr("Scroll left") : tr("Scroll up"), this, [this] {
        triggerAction(QAbstractSlider::SliderSingleStepSub);
    });
    menu->addAction(horiz ? tr("Scroll right") : tr("Scroll down"), this, [this] {
        triggerAction(QAbstractSlider::SliderSingleStepAdd);
    });
    return menu;
#else
    Q_UNUSED(position);
    return nullptr;
#endif // QT_CONFIG(menu)
}